

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

Template * ctemplate::Template::StringToTemplate(TemplateString *content,Strip strip)

{
  bool bVar1;
  TemplateState TVar2;
  Template *this;
  size_t sVar3;
  char *__src;
  size_t local_68;
  size_t content_len;
  char *buffer;
  TemplateString local_48;
  Template *local_28;
  Template *tpl;
  TemplateString *pTStack_18;
  Strip strip_local;
  TemplateString *content_local;
  
  tpl._4_4_ = strip;
  pTStack_18 = content;
  this = (Template *)operator_new(0xc0);
  TemplateString::TemplateString(&local_48,"");
  Template(this,&local_48,tpl._4_4_,(TemplateCache *)0x0);
  local_28 = this;
  sVar3 = TemplateString::size(pTStack_18);
  content_len = (size_t)operator_new__(sVar3);
  local_68 = TemplateString::size(pTStack_18);
  sVar3 = content_len;
  __src = TemplateString::data(pTStack_18);
  memcpy((void *)sVar3,__src,local_68);
  StripBuffer(local_28,(char **)&content_len,&local_68);
  bVar1 = BuildTree(local_28,(char *)content_len,(char *)(content_len + local_68));
  if (bVar1) {
    TVar2 = state(local_28);
    if (TVar2 != TS_READY) {
      __assert_fail("tpl->state() == TS_READY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0x865,
                    "static Template *ctemplate::Template::StringToTemplate(const TemplateString &, Strip)"
                   );
    }
    content_local = (TemplateString *)local_28;
  }
  else {
    TVar2 = state(local_28);
    if (TVar2 == TS_READY) {
      __assert_fail("tpl->state() != TS_READY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0x867,
                    "static Template *ctemplate::Template::StringToTemplate(const TemplateString &, Strip)"
                   );
    }
    if (local_28 != (Template *)0x0) {
      (*local_28->_vptr_Template[1])();
    }
    content_local = (TemplateString *)0x0;
  }
  return (Template *)content_local;
}

Assistant:

Template* Template::StringToTemplate(const TemplateString& content,
                                     Strip strip) {
  // An empty original_filename_ keeps ReloadIfChangedLocked from performing
  // file operations.

  Template *tpl = new Template("", strip, NULL);

  // But we have to do the "loading" and parsing ourselves:

  // BuildTree deletes the buffer when done, so we need a copy for it.
  char* buffer = new char[content.size()];
  size_t content_len = content.size();
  memcpy(buffer, content.data(), content_len);
  tpl->StripBuffer(&buffer, &content_len);
  if ( tpl->BuildTree(buffer, buffer + content_len) ) {
    assert(tpl->state() == TS_READY);
  } else {
    assert(tpl->state() != TS_READY);
    delete tpl;
    return NULL;
  }
  return tpl;
}